

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O1

bool __thiscall
GlobOpt::IsWorthSpecializingToInt32Branch(GlobOpt *this,Instr *instr,Value *src1Val,Value *src2Val)

{
  Opnd *pOVar1;
  code *pcVar2;
  bool bVar3;
  OpndKind OVar4;
  undefined4 *puVar5;
  bool bVar6;
  
  bVar3 = ValueInfo::HasIntConstantValue(src1Val->valueInfo,false);
  bVar6 = true;
  if (!bVar3) {
    OVar4 = IR::Opnd::GetKind(instr->m_src1);
    if (OVar4 != OpndKindReg) {
      return true;
    }
    pOVar1 = instr->m_src1;
    OVar4 = IR::Opnd::GetKind(pOVar1);
    if (OVar4 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar3) goto LAB_00468d99;
      *puVar5 = 0;
    }
    bVar3 = GlobOptBlockData::IsInt32TypeSpecialized
                      (&this->currentBlock->globOptData,(Sym *)pOVar1[1]._vptr_Opnd);
    if (((!bVar3) && (bVar3 = ValueInfo::HasIntConstantValue(src2Val->valueInfo,false), !bVar3)) &&
       (OVar4 = IR::Opnd::GetKind(instr->m_src2), OVar4 == OpndKindReg)) {
      pOVar1 = instr->m_src2;
      OVar4 = IR::Opnd::GetKind(pOVar1);
      if (OVar4 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar3) {
LAB_00468d99:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar5 = 0;
      }
      bVar3 = GlobOptBlockData::IsInt32TypeSpecialized
                        (&this->currentBlock->globOptData,(Sym *)pOVar1[1]._vptr_Opnd);
      if (!bVar3) {
        bVar6 = false;
      }
    }
  }
  return bVar6;
}

Assistant:

bool
GlobOpt::IsWorthSpecializingToInt32Branch(IR::Instr const * instr, Value const * src1Val, Value const * src2Val) const
{
    if (!src1Val->GetValueInfo()->HasIntConstantValue() && instr->GetSrc1()->IsRegOpnd())
    {
        StackSym const *sym1 = instr->GetSrc1()->AsRegOpnd()->m_sym;
        if (CurrentBlockData()->IsInt32TypeSpecialized(sym1) == false)
        {
            if (!src2Val->GetValueInfo()->HasIntConstantValue() && instr->GetSrc2()->IsRegOpnd())
            {
                StackSym const *sym2 = instr->GetSrc2()->AsRegOpnd()->m_sym;
                if (CurrentBlockData()->IsInt32TypeSpecialized(sym2) == false)
                {
                    // Type specializing a Br itself isn't worth it, unless one src
                    // is already type specialized
                    return false;
                }
            }
        }
    }
    return true;
}